

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_font_atlas_end(nk_font_atlas *atlas,nk_handle texture,nk_draw_null_texture *null)

{
  nk_font *pnVar1;
  long lVar2;
  
  if (atlas != (nk_font_atlas *)0x0) {
    if (null != (nk_draw_null_texture *)0x0) {
      null->texture = texture;
      (null->uv).x = ((float)(int)(atlas->custom).x + 0.5) / (float)atlas->tex_width;
      (null->uv).y = ((float)(int)(atlas->custom).y + 0.5) / (float)atlas->tex_height;
    }
    for (pnVar1 = atlas->fonts; pnVar1 != (nk_font *)0x0; pnVar1 = pnVar1->next) {
      pnVar1->texture = texture;
      (pnVar1->handle).texture = texture;
    }
    lVar2 = 0x48;
    do {
      *(nk_handle *)((long)(&atlas->cursors[0].img + -3) + lVar2) = texture;
      lVar2 = lVar2 + 0x28;
    } while (lVar2 != 0x160);
    (*(atlas->temporary).free)((atlas->temporary).userdata,atlas->pixel);
    atlas->pixel = (void *)0x0;
    atlas->tex_width = 0;
    atlas->tex_height = 0;
    (atlas->custom).x = 0;
    (atlas->custom).y = 0;
    (atlas->custom).w = 0;
    (atlas->custom).h = 0;
    return;
  }
  __assert_fail("atlas",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x30cd,
                "void nk_font_atlas_end(struct nk_font_atlas *, nk_handle, struct nk_draw_null_texture *)"
               );
}

Assistant:

NK_API void
nk_font_atlas_end(struct nk_font_atlas *atlas, nk_handle texture,
    struct nk_draw_null_texture *null)
{
    int i = 0;
    struct nk_font *font_iter;
    NK_ASSERT(atlas);
    if (!atlas) {
        if (!null) return;
        null->texture = texture;
        null->uv = nk_vec2(0.5f,0.5f);
    }
    if (null) {
        null->texture = texture;
        null->uv.x = (atlas->custom.x + 0.5f)/(float)atlas->tex_width;
        null->uv.y = (atlas->custom.y + 0.5f)/(float)atlas->tex_height;
    }
    for (font_iter = atlas->fonts; font_iter; font_iter = font_iter->next) {
        font_iter->texture = texture;
#ifdef NK_INCLUDE_VERTEX_BUFFER_OUTPUT
        font_iter->handle.texture = texture;
#endif
    }
    for (i = 0; i < NK_CURSOR_COUNT; ++i)
        atlas->cursors[i].img.handle = texture;

    atlas->temporary.free(atlas->temporary.userdata, atlas->pixel);
    atlas->pixel = 0;
    atlas->tex_width = 0;
    atlas->tex_height = 0;
    atlas->custom.x = 0;
    atlas->custom.y = 0;
    atlas->custom.w = 0;
    atlas->custom.h = 0;
}